

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_iso_Z.c
# Opt level: O0

void test1(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  uint uVar4;
  archive_conflict *a_00;
  time_t tVar5;
  dev_t v2;
  la_int64_t lVar6;
  char *pcVar7;
  char *name;
  archive *a;
  archive_entry *ae;
  
  extract_reference_file("test_read_format_iso.iso.Z");
  a_00 = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                   ,L'$',(uint)(a_00 != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'&',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",a_00);
  iVar1 = archive_read_support_format_all((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'(',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",a_00);
  wVar2 = archive_read_open_filename(a_00,"test_read_format_iso.iso.Z",0x200);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'*',0,"ARCHIVE_OK",(long)wVar2,"archive_read_open_filename(a, name, 512)",
                      a_00);
  iVar1 = archive_read_next_header((archive *)a_00,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'.',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a_00);
  tVar5 = archive_entry_atime((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'/',0x437052bc,"1131434684",tVar5,"archive_entry_atime(ae)",a_00);
  tVar5 = archive_entry_birthtime((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'0',0,"0",tVar5,"archive_entry_birthtime(ae)",a_00);
  tVar5 = archive_entry_ctime((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'1',0x437052bc,"1131434684",tVar5,"archive_entry_ctime(ae)",a_00);
  v2 = archive_entry_dev((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'2',0,"0",v2,"archive_entry_dev(ae)",a_00);
  mVar3 = archive_entry_filetype((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'3',0x4000,"AE_IFDIR",(ulong)mVar3,"archive_entry_filetype(ae)",a_00);
  lVar6 = archive_entry_gid((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'4',0,"0",lVar6,"archive_entry_gid(ae)",a_00);
  pcVar7 = archive_entry_gname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
             ,L'5',(char *)0x0,"NULL",pcVar7,"archive_entry_gname(ae)",a_00,L'\0');
  lVar6 = archive_entry_ino((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'6',0,"0",lVar6,"archive_entry_ino(ae)",a_00);
  mVar3 = archive_entry_mode((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'7',0x41c0,"AE_IFDIR | 0700",(ulong)mVar3,"archive_entry_mode(ae)",a_00);
  tVar5 = archive_entry_mtime((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'8',0x437052bc,"1131434684",tVar5,"archive_entry_mtime(ae)",a_00);
  uVar4 = archive_entry_nlink((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'9',2,"2",(ulong)uVar4,"archive_entry_nlink(ae)",a_00);
  pcVar7 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
             ,L':',".","\".\"",pcVar7,"archive_entry_pathname(ae)",a_00,L'\0');
  mVar3 = archive_entry_perm((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L';',0x1c0,"0700",(ulong)mVar3,"archive_entry_perm(ae)",a_00);
  lVar6 = archive_entry_size((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'<',0x800,"2048",lVar6,"archive_entry_size(ae)",a_00);
  lVar6 = archive_entry_uid((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'=',0,"0",lVar6,"archive_entry_uid(ae)",a_00);
  pcVar7 = archive_entry_uname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
             ,L'>',(char *)0x0,"NULL",pcVar7,"archive_entry_uname(ae)",a_00,L'\0');
  iVar1 = archive_read_next_header((archive *)a_00,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'A',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",a_00);
  iVar1 = archive_file_count((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'B',1,"1",(long)iVar1,"archive_file_count(a)",(void *)0x0);
  iVar1 = archive_filter_code((archive *)a_00,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'D',(long)iVar1,"archive_filter_code(a, 0)",3,"ARCHIVE_FILTER_COMPRESS",
                      (void *)0x0);
  iVar1 = archive_format((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'E',(long)iVar1,"archive_format(a)",0x40000,"ARCHIVE_FORMAT_ISO9660",
                      (void *)0x0);
  wVar2 = archive_entry_is_encrypted((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'F',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'G',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",a_00);
  iVar1 = archive_read_close((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'H',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",a_00);
  iVar1 = archive_read_free((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'I',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

static void
test1(void)
{
	struct archive_entry *ae;
	struct archive *a;
	const char *name = "test_read_format_iso.iso.Z";

	extract_reference_file(name);

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, name, 512));

	/* Root directory */
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_next_header(a, &ae));
	assertEqualIntA(a, 1131434684, archive_entry_atime(ae));
	assertEqualIntA(a, 0, archive_entry_birthtime(ae));
	assertEqualIntA(a, 1131434684, archive_entry_ctime(ae));
	assertEqualIntA(a, 0, archive_entry_dev(ae));
	assertEqualIntA(a, AE_IFDIR, archive_entry_filetype(ae));
	assertEqualIntA(a, 0, archive_entry_gid(ae));
	assertEqualStringA(a, NULL, archive_entry_gname(ae));
	assertEqualIntA(a, 0, archive_entry_ino(ae));
	assertEqualIntA(a, AE_IFDIR | 0700, archive_entry_mode(ae));
	assertEqualIntA(a, 1131434684, archive_entry_mtime(ae));
	assertEqualIntA(a, 2, archive_entry_nlink(ae));
	assertEqualStringA(a, ".", archive_entry_pathname(ae));
	assertEqualIntA(a, 0700, archive_entry_perm(ae));
	assertEqualIntA(a, 2048, archive_entry_size(ae));
	assertEqualIntA(a, 0, archive_entry_uid(ae));
	assertEqualStringA(a, NULL, archive_entry_uname(ae));

	assertEqualIntA(a, ARCHIVE_EOF,
	    archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_file_count(a));
	assertEqualInt(archive_filter_code(a, 0),
	    ARCHIVE_FILTER_COMPRESS);
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_ISO9660);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}